

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_struct_definition
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool is_result)

{
  int *piVar1;
  bool is_result_00;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  t_type *ptVar5;
  pointer pptVar6;
  undefined4 extraout_var;
  undefined3 in_register_00000081;
  char *pcVar7;
  pointer pptVar8;
  string access;
  string param;
  string local_98;
  undefined4 local_74;
  string local_70;
  string local_50;
  
  local_74 = CONCAT31(in_register_00000081,is_result);
  generate_php_doc(this,out,(t_doc *)tstruct);
  poVar4 = std::operator<<(out,"class ");
  php_namespace_declaration_abi_cxx11_(&local_70,this,&tstruct->super_t_type);
  std::operator<<(poVar4,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (is_exception) {
    pcVar7 = "TException";
  }
  else {
    if (this->oop_ != true) goto LAB_002706b3;
    pcVar7 = "TBase";
  }
  poVar4 = std::operator<<(out," extends ");
  std::operator<<(poVar4,pcVar7);
LAB_002706b3:
  if (this->json_serializable_ == true) {
    std::operator<<(out," implements JsonSerializable");
  }
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,"static public $isValidate = ");
  pcVar7 = "false";
  if (this->validate_ != false) {
    pcVar7 = "true";
  }
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  generate_php_struct_spec(this,out,tstruct);
  for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    std::__cxx11::string::string((string *)&local_70,"null",(allocator *)&local_98);
    ptVar5 = t_type::get_true_type((*pptVar8)->type_);
    if ((*pptVar8)->value_ != (t_const_value *)0x0) {
      iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xb])(ptVar5);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xc])(ptVar5);
        if ((char)iVar3 == '\0') {
          render_const_value_abi_cxx11_(&local_98,this,(*pptVar8)->type_,(*pptVar8)->value_);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
          std::__cxx11::string::~string((string *)&local_98);
        }
      }
    }
    generate_php_doc(this,out,*pptVar8);
    pcVar7 = "public";
    if (this->getters_setters_ != false) {
      pcVar7 = "private";
    }
    std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_50);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,(string *)&local_98);
    poVar4 = std::operator<<(poVar4," $");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar8)->name_);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  pcVar7 = "$vals = null";
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar7 = "";
  }
  std::__cxx11::string::string((string *)&local_70,pcVar7,(allocator *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"public function __construct(");
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar6 != pptVar8) {
    for (; pptVar8 != pptVar6; pptVar8 = pptVar8 + 1) {
      ptVar5 = t_type::get_true_type((*pptVar8)->type_);
      if ((*pptVar8)->value_ != (t_const_value *)0x0) {
        iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xb])(ptVar5);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xc])(ptVar5);
          if ((char)iVar3 == '\0') goto LAB_00270ac1;
        }
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"$this->");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar8)->name_);
        poVar4 = std::operator<<(poVar4," = ");
        render_const_value_abi_cxx11_(&local_98,this,ptVar5,(*pptVar8)->value_);
        poVar4 = std::operator<<(poVar4,(string *)&local_98);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_98);
      }
LAB_00270ac1:
      pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_98);
    poVar4 = std::operator<<(poVar4,"if (is_array($vals)) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if (this->oop_ == true) {
      t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_98);
      poVar4 = std::operator<<(poVar4,"parent::__construct(self::$_TSPEC, $vals);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      for (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar8 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
        t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_98);
        poVar4 = std::operator<<(poVar4,"if (isset($vals[\'");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar8)->name_);
        poVar4 = std::operator<<(poVar4,"\'])) {");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_98);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_98);
        poVar4 = std::operator<<(poVar4,"$this->");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar8)->name_);
        poVar4 = std::operator<<(poVar4," = $vals[\'");
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar8)->name_);
        poVar4 = std::operator<<(poVar4,"\'];");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_98);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
        poVar4 = std::operator<<(out,(string *)&local_98);
        poVar4 = std::operator<<(poVar4,"}");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_98);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"public function getName()");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"return \'");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = std::operator<<(poVar4,"\';");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  if (this->getters_setters_ == true) {
    generate_generic_field_getters_setters(this,out,tstruct);
  }
  is_result_00 = local_74._0_1_;
  generate_php_struct_reader(this,out,tstruct,local_74._0_1_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  generate_php_struct_writer(this,out,tstruct,is_result_00);
  bVar2 = needs_php_read_validator(this,tstruct,is_result_00);
  if (bVar2) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_read_validator(this,out,tstruct);
  }
  bVar2 = needs_php_write_validator(this,tstruct,is_result_00);
  if (bVar2) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_write_validator(this,out,tstruct);
  }
  if (this->json_serializable_ == true) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    generate_php_struct_json_serialize(this,out,tstruct,is_result_00);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_98);
  poVar4 = std::operator<<(poVar4,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_php_generator::generate_php_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception,
                                                     bool is_result) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  generate_php_doc(out, tstruct);
  out << "class " << php_namespace_declaration(tstruct);
  if (is_exception) {
    out << " extends "
        << "TException";
  } else if (oop_) {
    out << " extends "
        << "TBase";
  }
  if (json_serializable_) {
    out << " implements JsonSerializable";
  }
  out << endl
      << "{" << endl;
  indent_up();

  out << indent() << "static public $isValidate = " << (validate_ ? "true" : "false") << ";" << endl << endl;

  generate_php_struct_spec(out, tstruct);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    string dval = "null";
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr && !(t->is_struct() || t->is_xception())) {
      dval = render_const_value((*m_iter)->get_type(), (*m_iter)->get_value());
    }
    generate_php_doc(out, *m_iter);
    string access = (getters_setters_) ? "private" : "public";
    indent(out) << access << " $" << (*m_iter)->get_name() << " = " << dval << ";" << endl;
  }

  out << endl;

  // Generate constructor from array
  string param = (members.size() > 0) ? "$vals = null" : "";
  out << indent() << "public function __construct(" << param << ")"<< endl
      << indent() << "{" << endl;
  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if ((*m_iter)->get_value() != nullptr && (t->is_struct() || t->is_xception())) {
        indent(out) << "$this->" << (*m_iter)->get_name() << " = "
                    << render_const_value(t, (*m_iter)->get_value()) << ";" << endl;
      }
    }
    out << indent() << "if (is_array($vals)) {" << endl;
    indent_up();
    if (oop_) {
      out << indent() << "parent::__construct(self::$_TSPEC, $vals);" << endl;
    } else {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        out << indent() << "if (isset($vals['" << (*m_iter)->get_name() << "'])) {" << endl;

        indent_up();
        out << indent() << "$this->" << (*m_iter)->get_name() << " = $vals['"
            << (*m_iter)->get_name() << "'];" << endl;

        indent_down();
        out << indent() << "}" << endl;
      }
    }
    indent_down();
    out << indent() << "}" << endl;
  }
  scope_down(out);
  out << endl;

  out << indent() << "public function getName()" << endl
      << indent() << "{" << endl;

  indent_up();
  out << indent() << "return '" << tstruct->get_name() << "';" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;

  out << endl;
  if (getters_setters_) {
    generate_generic_field_getters_setters(out, tstruct);
  }
  generate_php_struct_reader(out, tstruct, is_result);
  out << endl;
  generate_php_struct_writer(out, tstruct, is_result);
  if (needs_php_read_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_read_validator(out, tstruct);
  }
  if (needs_php_write_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_write_validator(out, tstruct);
  }
  if (json_serializable_) {
    out << endl;
    generate_php_struct_json_serialize(out, tstruct, is_result);
  }

  indent_down();
  out << indent() << "}" << endl;
}